

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MakeCurrentPerfCase::createPixmap(MakeCurrentPerfCase *this)

{
  pointer *pppNVar1;
  pointer *pppvVar2;
  iterator __position;
  iterator __position_00;
  NativePixmapFactory *pNVar3;
  NativePixmap *pixmap;
  EGLSurface pvVar4;
  EGLSurface local_28;
  NativePixmap *local_20;
  
  EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar3 = eglu::selectNativePixmapFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pixmap = (NativePixmap *)
           (**(code **)(*(long *)pNVar3 + 0x20))
                     (pNVar3,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,this->m_display,this->m_config,0,0x100,0x100);
  local_20 = pixmap;
  pvVar4 = eglu::createPixmapSurface
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,pixmap,this->m_display,this->m_config,(EGLAttrib *)0x0);
  __position._M_current =
       (this->m_pixmaps).
       super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pvVar4;
  if (__position._M_current ==
      (this->m_pixmaps).
      super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<eglu::NativePixmap*,std::allocator<eglu::NativePixmap*>>::
    _M_realloc_insert<eglu::NativePixmap*const&>
              ((vector<eglu::NativePixmap*,std::allocator<eglu::NativePixmap*>> *)&this->m_pixmaps,
               __position,&local_20);
  }
  else {
    *__position._M_current = pixmap;
    pppNVar1 = &(this->m_pixmaps).
                super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  __position_00._M_current =
       (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->m_surfaces,__position_00,&local_28);
  }
  else {
    *__position_00._M_current = pvVar4;
    pppvVar2 = &(this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar2 = *pppvVar2 + 1;
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createPixmap (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativePixmap*					pixmap			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		pixmap	= pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, width, height);
		surface	= eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete pixmap;
		throw;
	}

	m_pixmaps.push_back(pixmap);
	m_surfaces.push_back(surface);
}